

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O3

char * ucs4_to_utf8(ucs4_t *ucs4,size_t length)

{
  byte bVar1;
  uint uVar2;
  undefined1 *__ptr;
  char *pcVar3;
  byte bVar4;
  uint uVar5;
  long lVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  undefined1 *puVar10;
  ulong uVar11;
  
  uVar11 = 0;
  uVar8 = -(ulong)(length == 0) | length;
  do {
    if (ucs4[uVar11] == 0) {
      __ptr = (undefined1 *)malloc(0x400);
      puVar10 = __ptr;
      if (uVar11 == 0) goto LAB_00104a24;
      goto LAB_00104849;
    }
    uVar11 = uVar11 + 1;
  } while (uVar8 != uVar11);
  __ptr = (undefined1 *)malloc(0x400);
  uVar11 = uVar8;
LAB_00104849:
  lVar9 = 0x400;
  uVar8 = 0;
  puVar10 = __ptr;
  do {
    if (lVar9 < 7) {
      lVar9 = (long)puVar10 - (long)__ptr;
      __ptr = (undefined1 *)realloc(__ptr,lVar9 * 2);
      puVar10 = __ptr + lVar9;
    }
    uVar2 = ucs4[uVar8];
    if (uVar2 < 0x80) {
      lVar6 = 1;
    }
    else {
      bVar4 = (byte)uVar2;
      bVar1 = (byte)(uVar2 >> 8);
      if (uVar2 < 0x800) {
        puVar10[1] = bVar4 & 0x3f | 0x80;
        uVar2 = (uint)(byte)(((byte)(uVar2 >> 6) & 3) + bVar1 * '\x04' | 0xc0);
        lVar6 = 2;
      }
      else if (uVar2 < 0x10000) {
        puVar10[2] = bVar4 & 0x3f | 0x80;
        puVar10[1] = ((byte)(uVar2 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
        uVar2 = (uint)(byte)((byte)(uVar2 >> 0xc) | 0xe0);
        lVar6 = 3;
      }
      else {
        uVar5 = uVar2 >> 0x10;
        if (uVar2 < 0x200000) {
          puVar10[3] = bVar4 & 0x3f | 0x80;
          puVar10[2] = ((byte)(uVar2 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
          puVar10[1] = (byte)((uVar5 & 3) << 4) | (byte)(uVar2 >> 0xc) & 0xf | 0x80;
          uVar2 = (uint)(byte)((byte)(uVar2 >> 0x12) | 0xf0);
          lVar6 = 4;
        }
        else {
          bVar7 = (byte)(uVar2 >> 0x18);
          if (uVar2 < 0x4000000) {
            puVar10[4] = bVar4 & 0x3f | 0x80;
            puVar10[3] = ((byte)(uVar2 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
            puVar10[2] = (byte)((uVar5 & 3) << 4) | (byte)(uVar2 >> 0xc) & 0xf | 0x80;
            puVar10[1] = (byte)(uVar2 >> 0x12) & 0x3f | 0x80;
            uVar2 = (uint)(bVar7 | 0xf8);
            lVar6 = 5;
          }
          else {
            if ((int)uVar2 < 0) {
              free(__ptr);
              return (char *)0xffffffffffffffff;
            }
            puVar10[5] = bVar4 & 0x3f | 0x80;
            puVar10[4] = ((byte)(uVar2 >> 6) & 3) + (bVar1 & 0xf) * '\x04' | 0x80;
            puVar10[3] = (byte)((uVar5 & 3) << 4) | (byte)(uVar2 >> 0xc) & 0xf | 0x80;
            puVar10[2] = (byte)(uVar2 >> 0x12) & 0x3f | 0x80;
            puVar10[1] = bVar7 & 0x3f | 0x80;
            uVar2 = (uint)(byte)(bVar7 >> 6 | 0xfc);
            lVar6 = 6;
          }
        }
      }
    }
    *puVar10 = (char)uVar2;
    puVar10 = puVar10 + lVar6;
    lVar9 = lVar9 - lVar6;
    uVar8 = uVar8 + 1;
  } while (uVar11 != uVar8);
LAB_00104a24:
  pcVar3 = (char *)realloc(__ptr,((long)puVar10 - (long)__ptr) + 1);
  pcVar3[(long)puVar10 - (long)__ptr] = '\0';
  return pcVar3;
}

Assistant:

char * ucs4_to_utf8(const ucs4_t * ucs4, size_t length)
{
	if (length == 0)
		length = (size_t) -1;
	size_t i;
	for (i = 0; i < length && ucs4[i] != 0; i ++);
	length = i;

	size_t freesize = INITIAL_BUFF_SIZE;
	char * utf8 = (char *) malloc(sizeof(char) * freesize);
	char * putf8 = utf8;

	for (i = 0; i < length; i ++)
	{
		if ((ssize_t)freesize - 6 <= 0)
		{
			freesize = putf8 - utf8;
			utf8 = (char *) realloc(utf8, sizeof(char) * (freesize + freesize));
			putf8 = utf8 + freesize;
		}

		ucs4_t c = ucs4[i];
		ucs4_t byte[4] =
		{
			(c >> 0) & BITMASK(8), (c >> 8) & BITMASK(8),
			(c >> 16) & BITMASK(8), (c >> 24) & BITMASK(8)
		};
		
		size_t delta = 0;

		if (c <= 0x7F)
		{
			/* U-00000000 - U-0000007F */
			/* 0xxxxxxx */
			putf8[0] = byte[0] & BITMASK(7);
			delta = 1;
		}
		else if (c <= 0x7FF)
		{
			/* U-00000080 - U-000007FF */
			/* 110xxxxx 10xxxxxx */
			putf8[1] = 0x80 + (byte[0] & BITMASK(6));
			putf8[0] = 0xC0 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(3)) << 2);
			delta = 2;
		}
		else if (c <= 0xFFFF)
		{
			/* U-00000800 - U-0000FFFF */
			/* 1110xxxx 10xxxxxx 10xxxxxx */
			putf8[2] = 0x80 + (byte[0] & BITMASK(6));
			putf8[1] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[0] = 0xE0 + ((byte[1] >> 4) & BITMASK(4));
			delta = 3;
		}
		else if (c <= 0x1FFFFF)
		{
			/* U-00010000 - U-001FFFFF */
			/* 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[3] = 0x80 + (byte[0] & BITMASK(6));
			putf8[2] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[1] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[0] = 0xF0 + ((byte[2] >> 2) & BITMASK(3));
			delta = 4;
		}
		else if (c <= 0x3FFFFFF)
		{
			/* U-00200000 - U-03FFFFFF */
			/* 111110xx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[4] = 0x80 + (byte[0] & BITMASK(6));
			putf8[3] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[2] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[1] = 0x80 + ((byte[2] >> 2) & BITMASK(6));
			putf8[0] = 0xF8 + (byte[3] & BITMASK(2));
			delta = 5;

		}
		else if (c <= 0x7FFFFFFF)
		{
			/* U-04000000 - U-7FFFFFFF */
			/* 1111110x 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx 10xxxxxx */
			putf8[5] = 0x80 + (byte[0] & BITMASK(6));
			putf8[4] = 0x80 + ((byte[0] >> 6) & BITMASK(2)) +
					((byte[1] & BITMASK(4)) << 2);
			putf8[3] = 0x80 + ((byte[1] >> 4) & BITMASK(4)) +
					((byte[2] & BITMASK(2)) << 4);
			putf8[2] = 0x80 + ((byte[2] >> 2) & BITMASK(6));
			putf8[1] = 0x80 + (byte[3] & BITMASK(6));
			putf8[0] = 0xFC + ((byte[3] >> 6) & BITMASK(1)); 
			delta = 6;
		}
		else
		{
			free(utf8);
			return (char *) -1;
		}
		
		putf8 += delta;
		freesize -= delta;
	}

	length = (putf8 - utf8 + 1);
	utf8 = (char *) realloc(utf8, sizeof(char) * length);
	utf8[length - 1] = '\0';
	return utf8;
}